

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O0

object * object_split(object *src,wchar_t amt)

{
  object *dest_00;
  object *dest_01;
  object *dest_known;
  object *dest;
  wchar_t amt_local;
  object *src_local;
  
  dest_00 = object_new();
  object_copy(dest_00,src);
  if (src->known != (object *)0x0) {
    src->known->number = src->number;
    dest_01 = object_new();
    object_copy(dest_01,src->known);
    dest_00->known = dest_01;
  }
  if (amt < (int)(uint)src->number) {
    distribute_charges(src,dest_00,amt);
    if (src->known != (object *)0x0) {
      distribute_charges(src->known,dest_00->known,amt);
    }
    dest_00->number = (uint8_t)amt;
    src->number = src->number - (uint8_t)amt;
    if (src->note != 0) {
      dest_00->note = src->note;
    }
    if (src->known != (object *)0x0) {
      dest_00->known->number = dest_00->number;
      src->known->number = src->number;
      dest_00->known->note = src->known->note;
    }
    if (dest_00->known != (object *)0x0) {
      dest_00->known->oidx = 0;
    }
    dest_00->oidx = 0;
    return dest_00;
  }
  __assert_fail("src->number > amt",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-pile.c"
                ,0x31a,"struct object *object_split(struct object *, int)");
}

Assistant:

struct object *object_split(struct object *src, int amt)
{
	struct object *dest = object_new(), *dest_known;

	/* Get a copy of the object */
	object_copy(dest, src);

	/* Do we need a new known object? */
	if (src->known) {
		/* Ensure numbers are aligned (should not be necessary, but safer) */
		src->known->number = src->number;

		/* Make the new object */
		dest_known = object_new();
		object_copy(dest_known, src->known);
		dest->known = dest_known;
	}

	/* Check legality */
	assert(src->number > amt);

	/* Distribute charges of wands, staves, or rods */
	distribute_charges(src, dest, amt);
	if (src->known)
		distribute_charges(src->known, dest->known, amt);

	/* Modify quantity */
	dest->number = amt;
	src->number -= amt;
	if (src->note)
		dest->note = src->note;
	if (src->known) {
		dest->known->number = dest->number;
		src->known->number = src->number;
		dest->known->note = src->known->note;
	}

	/* Remove any index */
	if (dest->known)
		dest->known->oidx = 0;
	dest->oidx = 0;

	return dest;
}